

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_cache.c
# Opt level: O3

size_t cache_getused(void)

{
  uint32_t uVar1;
  size_t sVar2;
  uint32_t *puVar3;
  size_t sVar4;
  ulong uVar5;
  
  if (cache_size == 0) {
    sVar4 = 0;
  }
  else {
    sVar4 = 0;
    uVar5 = 0;
    sVar2 = cache_size;
    puVar3 = cache_status;
    do {
      uVar1 = puVar3[uVar5];
      if ((int)uVar1 < 0) {
        fwrite("cache_getuser: cache in use during cache_getused()\n",0x33,1,_stderr);
        sVar2 = cache_size;
        puVar3 = cache_status;
      }
      sVar4 = (sVar4 + 1) - (ulong)(uVar1 == 0);
      uVar5 = uVar5 + 1;
    } while (uVar5 < sVar2);
  }
  return sVar4;
}

Assistant:

size_t
cache_getused()
{
    size_t result = 0;
    for (size_t i=0;i<cache_size;i++) {
        uint32_t s = cache_status[i];
        if (s & 0x80000000) fprintf(stderr, "cache_getuser: cache in use during cache_getused()\n");
        if (s) result++;
    }
    return result;
}